

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult vmaCreateAllocator(VmaAllocatorCreateInfo *pCreateInfo,VmaAllocator *pAllocator)

{
  VkResult VVar1;
  VmaAllocator_T *pAllocationCallbacks;
  VmaAllocator_T *in_RSI;
  VkResult result;
  VmaAllocatorCreateInfo *in_stack_00000108;
  VmaAllocator_T *in_stack_00000110;
  VmaAllocator_T *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  pAllocationCallbacks = VmaAllocate<VmaAllocator_T>((VkAllocationCallbacks *)0x3014dc);
  VmaAllocator_T::VmaAllocator_T(in_stack_00000110,in_stack_00000108);
  *(VmaAllocator_T **)in_RSI = pAllocationCallbacks;
  VVar1 = VmaAllocator_T::Init
                    (in_RSI,(VmaAllocatorCreateInfo *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (VVar1 < VK_SUCCESS) {
    vma_delete<VmaAllocator_T>
              ((VkAllocationCallbacks *)pAllocationCallbacks,in_stack_ffffffffffffffd8);
    in_RSI->m_UseMutex = false;
    *(undefined3 *)&in_RSI->field_0x1 = 0;
    in_RSI->m_VulkanApiVersion = 0;
  }
  return VVar1;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaCreateAllocator(
    const VmaAllocatorCreateInfo* pCreateInfo,
    VmaAllocator* pAllocator)
{
    VMA_ASSERT(pCreateInfo && pAllocator);
    VMA_ASSERT(pCreateInfo->vulkanApiVersion == 0 ||
        (VK_VERSION_MAJOR(pCreateInfo->vulkanApiVersion) == 1 && VK_VERSION_MINOR(pCreateInfo->vulkanApiVersion) <= 3));
    VMA_DEBUG_LOG("vmaCreateAllocator");
    *pAllocator = vma_new(pCreateInfo->pAllocationCallbacks, VmaAllocator_T)(pCreateInfo);
    VkResult result = (*pAllocator)->Init(pCreateInfo);
    if(result < 0)
    {
        vma_delete(pCreateInfo->pAllocationCallbacks, *pAllocator);
        *pAllocator = VK_NULL_HANDLE;
    }
    return result;
}